

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void send_negotiation(connectdata *conn,int cmd,int option)

{
  Curl_easy *data_00;
  ssize_t sVar1;
  uint *puVar2;
  Curl_easy *data;
  int err;
  ssize_t bytes_written;
  int local_18;
  int iStack_14;
  uchar buf [3];
  int option_local;
  int cmd_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  bytes_written._5_1_ = 0xff;
  bytes_written._6_1_ = (undefined1)cmd;
  bytes_written._7_1_ = (undefined1)option;
  local_18 = option;
  iStack_14 = cmd;
  sVar1 = send(conn->sock[0],(void *)((long)&bytes_written + 5),3,0x4000);
  if (sVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar2);
  }
  printoption(conn->data,"SENT",iStack_14,local_18);
  return;
}

Assistant:

static void send_negotiation(struct connectdata *conn, int cmd, int option)
{
   unsigned char buf[3];
   ssize_t bytes_written;
   int err;
   struct Curl_easy *data = conn->data;

   buf[0] = CURL_IAC;
   buf[1] = (unsigned char)cmd;
   buf[2] = (unsigned char)option;

   bytes_written = swrite(conn->sock[FIRSTSOCKET], buf, 3);
   if(bytes_written < 0) {
     err = SOCKERRNO;
     failf(data,"Sending data failed (%d)",err);
   }

   printoption(conn->data, "SENT", cmd, option);
}